

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

void __thiscall ncnn::ParamDict::ParamDict(ParamDict *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  lVar2 = 0x18;
  do {
    puVar1 = (undefined8 *)((long)&this->params[0].v.refcount + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&this->params[0].loaded + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->params + lVar2 + -0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)&this->params[0].v.allocator + lVar2) = 0;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0x518);
  this->use_winograd_convolution = 1;
  this->use_sgemm_convolution = 1;
  this->use_int8_inference = 1;
  clear(this);
  return;
}

Assistant:

ParamDict::ParamDict()
{
    use_winograd_convolution = 1;
    use_sgemm_convolution = 1;
    use_int8_inference = 1;

    clear();
}